

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdb.c
# Opt level: O0

int mdb_rebalance(MDB_cursor *mc)

{
  MDB_page *pMVar1;
  int iVar2;
  uint uVar3;
  indx_t *piVar4;
  MDB_cursor **tp;
  MDB_cursor *tracked;
  MDB_cursor dummy;
  MDB_xcursor *pMStack_1f8;
  MDB_dbi dbi_1;
  MDB_cursor *m3_1;
  MDB_cursor *m2_1;
  int i;
  MDB_dbi dbi;
  MDB_cursor *m3;
  MDB_cursor *m2;
  MDB_page *mp;
  undefined1 local_1c0 [6];
  indx_t oldki;
  MDB_cursor mn;
  uint local_30;
  uint thresh;
  uint minkeys;
  uint ptop;
  int fromleft;
  int rc;
  MDB_node *node;
  MDB_cursor *mc_local;
  
  if ((mc->mc_pg[mc->mc_top]->mp_flags & 1) == 1) {
    local_30 = 2;
    mn.mc_ki[0x1e] = 1;
    mn.mc_ki[0x1f] = 0;
  }
  else {
    local_30 = 1;
    mn.mc_ki[0x1e] = 0xfa;
    mn.mc_ki[0x1f] = 0;
  }
  if ((((ulong)((mc->mc_txn->mt_env->me_psize - 0x10) -
               ((uint)(mc->mc_pg[mc->mc_top]->mp_pb).pb.pb_upper -
                (uint)(mc->mc_pg[mc->mc_top]->mp_pb).pb.pb_lower & 0xffff)) * 1000) /
       (ulong)(mc->mc_txn->mt_env->me_psize - 0x10) < (ulong)(uint)mn.mc_ki._60_4_) ||
     ((mc->mc_pg[mc->mc_top]->mp_pb).pb.pb_lower - 0x10 >> 1 < local_30)) {
    if (mc->mc_snum < 2) {
      pMVar1 = mc->mc_pg[0];
      if ((pMVar1->mp_flags & 0x40) == 0x40) {
        mc_local._4_4_ = 0;
      }
      else {
        if ((pMVar1->mp_pb).pb.pb_lower - 0x10 >> 1 == 0) {
          mc->mc_db->md_root = 0xffffffffffffffff;
          mc->mc_db->md_depth = 0;
          mc->mc_db->md_leaf_pages = 0;
          iVar2 = mdb_midl_append(&mc->mc_txn->mt_free_pgs,(pMVar1->mp_p).p_pgno);
          if (iVar2 != 0) {
            return iVar2;
          }
          mc->mc_snum = 0;
          mc->mc_top = 0;
          mc->mc_flags = mc->mc_flags & 0xfffffffe;
          for (m3 = mc->mc_txn->mt_cursors[mc->mc_dbi]; m3 != (MDB_cursor *)0x0; m3 = m3->mc_next) {
            if ((mc->mc_flags & 4) == 0) {
              _i = (MDB_xcursor *)m3;
            }
            else {
              _i = m3->mc_xcursor;
            }
            if (((((_i->mx_cursor).mc_flags & 1) != 0) && (mc->mc_snum <= (_i->mx_cursor).mc_snum))
               && ((_i->mx_cursor).mc_pg[0] == pMVar1)) {
              (_i->mx_cursor).mc_snum = 0;
              (_i->mx_cursor).mc_top = 0;
              (_i->mx_cursor).mc_flags = (_i->mx_cursor).mc_flags & 0xfffffffe;
            }
          }
        }
        else if (((pMVar1->mp_flags & 1) == 1) && ((pMVar1->mp_pb).pb.pb_lower - 0x10 >> 1 == 1)) {
          iVar2 = mdb_midl_append(&mc->mc_txn->mt_free_pgs,(pMVar1->mp_p).p_pgno);
          if (iVar2 != 0) {
            return iVar2;
          }
          mc->mc_db->md_root =
               (ulong)CONCAT24(*(undefined2 *)
                                ((long)pMVar1->mp_ptrs + (long)(int)(uint)pMVar1->mp_ptrs[0] + -0xc)
                               ,CONCAT22(*(undefined2 *)
                                          ((long)pMVar1->mp_ptrs +
                                          (long)(int)(uint)pMVar1->mp_ptrs[0] + -0xe),
                                         *(undefined2 *)
                                          ((long)pMVar1->mp_ptrs +
                                          (long)(int)(uint)pMVar1->mp_ptrs[0] + -0x10)));
          iVar2 = mdb_page_get(mc,mc->mc_db->md_root,mc->mc_pg,(int *)0x0);
          if (iVar2 != 0) {
            return iVar2;
          }
          mc->mc_db->md_depth = mc->mc_db->md_depth - 1;
          mc->mc_db->md_branch_pages = mc->mc_db->md_branch_pages - 1;
          mc->mc_ki[0] = mc->mc_ki[1];
          for (m2_1._0_4_ = 1; (int)m2_1 < (int)(uint)mc->mc_db->md_depth;
              m2_1._0_4_ = (int)m2_1 + 1) {
            mc->mc_pg[(int)m2_1] = mc->mc_pg[(int)m2_1 + 1];
            mc->mc_ki[(int)m2_1] = mc->mc_ki[(int)m2_1 + 1];
          }
          for (m3_1 = mc->mc_txn->mt_cursors[mc->mc_dbi]; m3_1 != (MDB_cursor *)0x0;
              m3_1 = m3_1->mc_next) {
            if ((mc->mc_flags & 4) == 0) {
              pMStack_1f8 = (MDB_xcursor *)m3_1;
            }
            else {
              pMStack_1f8 = m3_1->mc_xcursor;
            }
            if (((pMStack_1f8 != (MDB_xcursor *)mc) &&
                (((pMStack_1f8->mx_cursor).mc_flags & 1) != 0)) &&
               ((pMStack_1f8->mx_cursor).mc_pg[0] == pMVar1)) {
              for (m2_1._0_4_ = 0; (int)m2_1 < (int)(uint)mc->mc_db->md_depth;
                  m2_1._0_4_ = (int)m2_1 + 1) {
                (pMStack_1f8->mx_cursor).mc_pg[(int)m2_1] =
                     (pMStack_1f8->mx_cursor).mc_pg[(int)m2_1 + 1];
                (pMStack_1f8->mx_cursor).mc_ki[(int)m2_1] =
                     (pMStack_1f8->mx_cursor).mc_ki[(int)m2_1 + 1];
              }
              (pMStack_1f8->mx_cursor).mc_snum = (pMStack_1f8->mx_cursor).mc_snum - 1;
              (pMStack_1f8->mx_cursor).mc_top = (pMStack_1f8->mx_cursor).mc_top - 1;
            }
          }
        }
        mc_local._4_4_ = 0;
      }
    }
    else {
      uVar3 = mc->mc_top - 1;
      if ((mc->mc_pg[uVar3]->mp_pb).pb.pb_lower - 0x10 >> 1 < 2) {
        mdb_assert_fail(mc->mc_txn->mt_env,"NUMKEYS(mc->mc_pg[ptop]) > 1","mdb_rebalance",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/moneroexamples[P]lmdbcpp-test/ext/liblmdb/mdb.c"
                        ,0x22f5);
      }
      mdb_cursor_copy(mc,(MDB_cursor *)local_1c0);
      mn.mc_backup = (MDB_cursor *)0x0;
      mp._6_2_ = mc->mc_ki[mc->mc_top];
      if (mc->mc_ki[uVar3] == 0) {
        mn.mc_ki[(ulong)uVar3 - 4] = mn.mc_ki[(ulong)uVar3 - 4] + 1;
        iVar2 = mdb_page_get(mc,(ulong)*(uint6 *)((long)mc->mc_pg[uVar3]->mp_ptrs +
                                                 (long)(int)(uint)mc->mc_pg[uVar3]->mp_ptrs
                                                                  [mn.mc_ki[(ulong)uVar3 - 4]] +
                                                 -0x10),mn.mc_pg + ((ulong)mn.mc_dbflag._2_2_ - 1),
                             (int *)0x0);
        if (iVar2 != 0) {
          return iVar2;
        }
        mn.mc_ki[(ulong)mn.mc_dbflag._2_2_ - 4] = 0;
        mc->mc_ki[mc->mc_top] = (indx_t)((mc->mc_pg[mc->mc_top]->mp_pb).pb.pb_lower - 0x10 >> 1);
        minkeys = 0;
      }
      else {
        mn.mc_ki[(ulong)uVar3 - 4] = mn.mc_ki[(ulong)uVar3 - 4] - 1;
        iVar2 = mdb_page_get(mc,(ulong)*(uint6 *)((long)mc->mc_pg[uVar3]->mp_ptrs +
                                                 (long)(int)(uint)mc->mc_pg[uVar3]->mp_ptrs
                                                                  [mn.mc_ki[(ulong)uVar3 - 4]] +
                                                 -0x10),mn.mc_pg + ((ulong)mn.mc_dbflag._2_2_ - 1),
                             (int *)0x0);
        if (iVar2 != 0) {
          return iVar2;
        }
        mn.mc_ki[(ulong)mn.mc_dbflag._2_2_ - 4] =
             (short)((mn.mc_pg[(ulong)mn.mc_dbflag._2_2_ - 1]->mp_pb).pb.pb_lower - 0x10 >> 1) - 1;
        mc->mc_ki[mc->mc_top] = 0;
        minkeys = 1;
      }
      if ((((ulong)((mc->mc_txn->mt_env->me_psize - 0x10) -
                   ((uint)(mn.mc_pg[(ulong)mn.mc_dbflag._2_2_ - 1]->mp_pb).pb.pb_upper -
                    (uint)(mn.mc_pg[(ulong)mn.mc_dbflag._2_2_ - 1]->mp_pb).pb.pb_lower & 0xffff)) *
           1000) / (ulong)(mc->mc_txn->mt_env->me_psize - 0x10) < (ulong)(uint)mn.mc_ki._60_4_) ||
         ((mn.mc_pg[(ulong)mn.mc_dbflag._2_2_ - 1]->mp_pb).pb.pb_lower - 0x10 >> 1 <= local_30)) {
        if (minkeys == 0) {
          ptop = mdb_page_merge((MDB_cursor *)local_1c0,mc);
        }
        else {
          mp._6_2_ = mp._6_2_ +
                     (short)((mn.mc_pg[(ulong)mn.mc_dbflag._2_2_ - 1]->mp_pb).pb.pb_lower - 0x10 >>
                            1);
          mn.mc_ki[(ulong)mn.mc_dbflag._2_2_ - 4] =
               mn.mc_ki[(ulong)mn.mc_dbflag._2_2_ - 4] + mc->mc_ki[mn.mc_dbflag._2_2_] + 1;
          piVar4 = ((mn.mc_xcursor)->mx_cursor).mc_pg[4]->mp_ptrs + (ulong)(uint)mn.mc_txn * 4 + -8;
          if ((mn.mc_dbflag._4_4_ & 4) == 0) {
            tp = (MDB_cursor **)local_1c0;
          }
          else {
            dummy.mc_dbflag._4_4_ = 1;
            dummy.mc_backup = (MDB_cursor *)local_1c0;
            tp = &tracked;
          }
          *tp = *(MDB_cursor **)piVar4;
          *(MDB_cursor ***)piVar4 = tp;
          ptop = mdb_page_merge(mc,(MDB_cursor *)local_1c0);
          *(MDB_cursor **)piVar4 = *tp;
          mdb_cursor_copy((MDB_cursor *)local_1c0,mc);
        }
        mc->mc_flags = mc->mc_flags & 0xfffffffd;
      }
      else {
        ptop = mdb_node_move((MDB_cursor *)local_1c0,mc,minkeys);
        if (minkeys != 0) {
          mp._6_2_ = mp._6_2_ + 1;
        }
      }
      mc->mc_ki[mc->mc_top] = mp._6_2_;
      mc_local._4_4_ = ptop;
    }
  }
  else {
    mc_local._4_4_ = 0;
  }
  return mc_local._4_4_;
}

Assistant:

static int
mdb_rebalance(MDB_cursor *mc)
{
	MDB_node	*node;
	int rc, fromleft;
	unsigned int ptop, minkeys, thresh;
	MDB_cursor	mn;
	indx_t oldki;

	if (IS_BRANCH(mc->mc_pg[mc->mc_top])) {
		minkeys = 2;
		thresh = 1;
	} else {
		minkeys = 1;
		thresh = FILL_THRESHOLD;
	}
	DPRINTF(("rebalancing %s page %"Y"u (has %u keys, %.1f%% full)",
	    IS_LEAF(mc->mc_pg[mc->mc_top]) ? "leaf" : "branch",
	    mdb_dbg_pgno(mc->mc_pg[mc->mc_top]), NUMKEYS(mc->mc_pg[mc->mc_top]),
		(float)PAGEFILL(mc->mc_txn->mt_env, mc->mc_pg[mc->mc_top]) / 10));

	if (PAGEFILL(mc->mc_txn->mt_env, mc->mc_pg[mc->mc_top]) >= thresh &&
		NUMKEYS(mc->mc_pg[mc->mc_top]) >= minkeys) {
		DPRINTF(("no need to rebalance page %"Y"u, above fill threshold",
		    mdb_dbg_pgno(mc->mc_pg[mc->mc_top])));
		return MDB_SUCCESS;
	}

	if (mc->mc_snum < 2) {
		MDB_page *mp = mc->mc_pg[0];
		if (IS_SUBP(mp)) {
			DPUTS("Can't rebalance a subpage, ignoring");
			return MDB_SUCCESS;
		}
		if (NUMKEYS(mp) == 0) {
			DPUTS("tree is completely empty");
			mc->mc_db->md_root = P_INVALID;
			mc->mc_db->md_depth = 0;
			mc->mc_db->md_leaf_pages = 0;
			rc = mdb_midl_append(&mc->mc_txn->mt_free_pgs, mp->mp_pgno);
			if (rc)
				return rc;
			/* Adjust cursors pointing to mp */
			mc->mc_snum = 0;
			mc->mc_top = 0;
			mc->mc_flags &= ~C_INITIALIZED;
			{
				MDB_cursor *m2, *m3;
				MDB_dbi dbi = mc->mc_dbi;

				for (m2 = mc->mc_txn->mt_cursors[dbi]; m2; m2=m2->mc_next) {
					if (mc->mc_flags & C_SUB)
						m3 = &m2->mc_xcursor->mx_cursor;
					else
						m3 = m2;
					if (!(m3->mc_flags & C_INITIALIZED) || (m3->mc_snum < mc->mc_snum))
						continue;
					if (m3->mc_pg[0] == mp) {
						m3->mc_snum = 0;
						m3->mc_top = 0;
						m3->mc_flags &= ~C_INITIALIZED;
					}
				}
			}
		} else if (IS_BRANCH(mp) && NUMKEYS(mp) == 1) {
			int i;
			DPUTS("collapsing root page!");
			rc = mdb_midl_append(&mc->mc_txn->mt_free_pgs, mp->mp_pgno);
			if (rc)
				return rc;
			mc->mc_db->md_root = NODEPGNO(NODEPTR(mp, 0));
			rc = mdb_page_get(mc, mc->mc_db->md_root, &mc->mc_pg[0], NULL);
			if (rc)
				return rc;
			mc->mc_db->md_depth--;
			mc->mc_db->md_branch_pages--;
			mc->mc_ki[0] = mc->mc_ki[1];
			for (i = 1; i<mc->mc_db->md_depth; i++) {
				mc->mc_pg[i] = mc->mc_pg[i+1];
				mc->mc_ki[i] = mc->mc_ki[i+1];
			}
			{
				/* Adjust other cursors pointing to mp */
				MDB_cursor *m2, *m3;
				MDB_dbi dbi = mc->mc_dbi;

				for (m2 = mc->mc_txn->mt_cursors[dbi]; m2; m2=m2->mc_next) {
					if (mc->mc_flags & C_SUB)
						m3 = &m2->mc_xcursor->mx_cursor;
					else
						m3 = m2;
					if (m3 == mc) continue;
					if (!(m3->mc_flags & C_INITIALIZED))
						continue;
					if (m3->mc_pg[0] == mp) {
						for (i=0; i<mc->mc_db->md_depth; i++) {
							m3->mc_pg[i] = m3->mc_pg[i+1];
							m3->mc_ki[i] = m3->mc_ki[i+1];
						}
						m3->mc_snum--;
						m3->mc_top--;
					}
				}
			}
		} else
			DPUTS("root page doesn't need rebalancing");
		return MDB_SUCCESS;
	}

	/* The parent (branch page) must have at least 2 pointers,
	 * otherwise the tree is invalid.
	 */
	ptop = mc->mc_top-1;
	mdb_cassert(mc, NUMKEYS(mc->mc_pg[ptop]) > 1);

	/* Leaf page fill factor is below the threshold.
	 * Try to move keys from left or right neighbor, or
	 * merge with a neighbor page.
	 */

	/* Find neighbors.
	 */
	mdb_cursor_copy(mc, &mn);
	mn.mc_xcursor = NULL;

	oldki = mc->mc_ki[mc->mc_top];
	if (mc->mc_ki[ptop] == 0) {
		/* We're the leftmost leaf in our parent.
		 */
		DPUTS("reading right neighbor");
		mn.mc_ki[ptop]++;
		node = NODEPTR(mc->mc_pg[ptop], mn.mc_ki[ptop]);
		rc = mdb_page_get(mc, NODEPGNO(node), &mn.mc_pg[mn.mc_top], NULL);
		if (rc)
			return rc;
		mn.mc_ki[mn.mc_top] = 0;
		mc->mc_ki[mc->mc_top] = NUMKEYS(mc->mc_pg[mc->mc_top]);
		fromleft = 0;
	} else {
		/* There is at least one neighbor to the left.
		 */
		DPUTS("reading left neighbor");
		mn.mc_ki[ptop]--;
		node = NODEPTR(mc->mc_pg[ptop], mn.mc_ki[ptop]);
		rc = mdb_page_get(mc, NODEPGNO(node), &mn.mc_pg[mn.mc_top], NULL);
		if (rc)
			return rc;
		mn.mc_ki[mn.mc_top] = NUMKEYS(mn.mc_pg[mn.mc_top]) - 1;
		mc->mc_ki[mc->mc_top] = 0;
		fromleft = 1;
	}

	DPRINTF(("found neighbor page %"Y"u (%u keys, %.1f%% full)",
	    mn.mc_pg[mn.mc_top]->mp_pgno, NUMKEYS(mn.mc_pg[mn.mc_top]),
		(float)PAGEFILL(mc->mc_txn->mt_env, mn.mc_pg[mn.mc_top]) / 10));

	/* If the neighbor page is above threshold and has enough keys,
	 * move one key from it. Otherwise we should try to merge them.
	 * (A branch page must never have less than 2 keys.)
	 */
	if (PAGEFILL(mc->mc_txn->mt_env, mn.mc_pg[mn.mc_top]) >= thresh && NUMKEYS(mn.mc_pg[mn.mc_top]) > minkeys) {
		rc = mdb_node_move(&mn, mc, fromleft);
		if (fromleft) {
			/* if we inserted on left, bump position up */
			oldki++;
		}
	} else {
		if (!fromleft) {
			rc = mdb_page_merge(&mn, mc);
		} else {
			oldki += NUMKEYS(mn.mc_pg[mn.mc_top]);
			mn.mc_ki[mn.mc_top] += mc->mc_ki[mn.mc_top] + 1;
			/* We want mdb_rebalance to find mn when doing fixups */
			WITH_CURSOR_TRACKING(mn,
				rc = mdb_page_merge(mc, &mn));
			mdb_cursor_copy(&mn, mc);
		}
		mc->mc_flags &= ~C_EOF;
	}
	mc->mc_ki[mc->mc_top] = oldki;
	return rc;
}